

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O3

REF_STATUS ref_collapse_pass(REF_GRID ref_grid)

{
  REF_DBL *pRVar1;
  uint node0;
  REF_INT node1;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  REF_ADAPT pRVar3;
  REF_ADJ pRVar4;
  uint uVar5;
  int iVar6;
  REF_CELL *ppRVar7;
  REF_DBL *original;
  void *pvVar8;
  void *__s;
  REF_INT *pRVar9;
  long lVar10;
  REF_ADJ_ITEM pRVar11;
  undefined8 uVar12;
  ulong uVar13;
  char *pcVar14;
  REF_STATUS RVar15;
  long lVar16;
  ulong uVar17;
  REF_NODE pRVar18;
  double dVar19;
  REF_EDGE ref_edge;
  REF_DBL edge_ratio;
  REF_INT nodes [27];
  int local_e4;
  void *local_e0;
  REF_CELL local_d8;
  REF_EDGE local_d0;
  REF_INT *local_c8;
  ulong local_c0;
  long local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  ppRVar7 = ref_grid->cell + 3;
  if (ref_grid->surf == 0) {
    ppRVar7 = ref_grid->cell + 8;
  }
  pRVar2 = *ppRVar7;
  uVar5 = ref_edge_create(&local_d0,ref_grid);
  if (uVar5 != 0) {
    pcVar14 = "orig edges";
    uVar12 = 0x68;
    goto LAB_001b03c2;
  }
  iVar6 = ref_node->max;
  lVar16 = (long)iVar6;
  if (lVar16 < 0) {
    pcVar14 = "malloc ratio of REF_DBL negative";
    uVar12 = 0x6b;
LAB_001b064f:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar12,"ref_collapse_pass",pcVar14);
    RVar15 = 1;
  }
  else {
    original = (REF_DBL *)malloc(lVar16 * 8);
    if (original == (REF_DBL *)0x0) {
      pcVar14 = "malloc ratio of REF_DBL NULL";
      uVar12 = 0x6b;
    }
    else {
      if (iVar6 != 0) {
        pRVar3 = ref_grid->adapt;
        lVar10 = 0;
        do {
          dVar19 = pRVar3->collapse_ratio;
          original[lVar10] = dVar19 + dVar19;
          lVar10 = lVar10 + 1;
        } while (lVar16 != lVar10);
      }
      pRVar18 = ref_node;
      local_d8 = pRVar2;
      if (0 < local_d0->n) {
        lVar16 = 0;
        do {
          node0 = local_d0->e2n[lVar16 * 2];
          pRVar18 = (REF_NODE)(ulong)node0;
          node1 = local_d0->e2n[lVar16 * 2 + 1];
          uVar5 = ref_node_ratio(ref_node,node0,node1,&local_b0);
          if (uVar5 != 0) {
            pcVar14 = "ratio";
            uVar12 = 0x70;
            goto LAB_001b03c2;
          }
          dVar19 = original[(int)node0];
          if (local_b0 <= original[(int)node0]) {
            dVar19 = local_b0;
          }
          original[(int)node0] = dVar19;
          dVar19 = original[node1];
          if (local_b0 <= original[node1]) {
            dVar19 = local_b0;
          }
          original[node1] = dVar19;
          lVar16 = lVar16 + 1;
        } while (lVar16 < local_d0->n);
      }
      local_e4 = (int)pRVar18;
      if ((long)ref_node->n < 0) {
        pcVar14 = "malloc target of REF_INT negative";
        uVar12 = 0x75;
        goto LAB_001b064f;
      }
      pvVar8 = malloc((long)ref_node->n << 2);
      if (pvVar8 == (void *)0x0) {
        pcVar14 = "malloc target of REF_INT NULL";
        uVar12 = 0x75;
      }
      else {
        iVar6 = ref_node->max;
        lVar16 = (long)iVar6;
        if (lVar16 < 0) {
          pcVar14 = "malloc node2target of REF_INT negative";
          uVar12 = 0x76;
          goto LAB_001b064f;
        }
        __s = malloc(lVar16 * 4);
        if (__s == (void *)0x0) {
          pcVar14 = "malloc node2target of REF_INT NULL";
          uVar12 = 0x76;
        }
        else {
          if (iVar6 == 0) {
            uVar5 = 0;
          }
          else {
            memset(__s,0xff,lVar16 * 4);
            pRVar3 = ref_grid->adapt;
            lVar10 = 0;
            uVar5 = 0;
            do {
              dVar19 = original[lVar10];
              if (dVar19 < pRVar3->collapse_ratio) {
                *(uint *)((long)__s + lVar10 * 4) = uVar5;
                *(int *)((long)pvVar8 + (long)(int)uVar5 * 4) = (int)lVar10;
                original[(int)uVar5] = dVar19;
                uVar5 = uVar5 + 1;
              }
              lVar10 = lVar10 + 1;
            } while (lVar16 != lVar10);
            if ((int)uVar5 < 0) {
              pcVar14 = "malloc order of REF_INT negative";
              uVar12 = 0x81;
              goto LAB_001b064f;
            }
          }
          uVar13 = (ulong)uVar5;
          pRVar9 = (REF_INT *)malloc(uVar13 * 4);
          if (pRVar9 != (REF_INT *)0x0) {
            local_e0 = pvVar8;
            uVar5 = ref_sort_heap_dbl(uVar5,original,pRVar9);
            if (uVar5 == 0) {
              pvVar8 = local_e0;
              if (uVar13 != 0) {
                uVar17 = 0;
                local_c8 = pRVar9;
                local_c0 = uVar13;
                do {
                  pRVar1 = &ref_grid->adapt->collapse_ratio;
                  if (original[pRVar9[uVar17]] < *pRVar1 || original[pRVar9[uVar17]] == *pRVar1) {
                    iVar6 = *(int *)((long)pvVar8 + (long)pRVar9[uVar17] * 4);
                    lVar16 = (long)iVar6;
                    if (((-1 < lVar16) && (iVar6 < ref_node->max)) &&
                       (-1 < ref_node->global[lVar16])) {
                      uVar5 = ref_collapse_to_remove_node1(ref_grid,&local_e4,iVar6);
                      if (uVar5 != 0) {
                        pcVar14 = "collapse rm";
                        uVar12 = 0x89;
                        goto LAB_001b03c2;
                      }
                      pRVar9 = local_c8;
                      uVar13 = local_c0;
                      pvVar8 = local_e0;
                      if ((ref_node->max <= iVar6) || (ref_node->global[lVar16] < 0)) {
                        lVar16 = (long)local_e4;
                        ref_node->age[lVar16] = 0;
                        if ((-1 < lVar16) &&
                           ((pRVar4 = local_d8->ref_adj, local_e4 < pRVar4->nnode &&
                            (iVar6 = pRVar4->first[lVar16], iVar6 != -1)))) {
                          pRVar11 = pRVar4->item;
                          do {
                            pRVar2 = local_d8;
                            local_b8 = (long)iVar6;
                            uVar5 = ref_cell_nodes(local_d8,pRVar11[local_b8].ref,local_a8);
                            if (uVar5 != 0) {
                              pcVar14 = "cell nodes";
                              uVar12 = 0x8d;
                              goto LAB_001b03c2;
                            }
                            iVar6 = pRVar2->node_per;
                            if (0 < (long)iVar6) {
                              lVar16 = 0;
                              do {
                                lVar10 = (long)*(int *)((long)__s + (long)local_a8[lVar16] * 4);
                                if (lVar10 != -1) {
                                  dVar19 = ref_grid->adapt->collapse_ratio;
                                  original[lVar10] = dVar19 + dVar19;
                                }
                                lVar16 = lVar16 + 1;
                              } while (iVar6 != lVar16);
                            }
                            pRVar11 = local_d8->ref_adj->item;
                            iVar6 = pRVar11[local_b8].next;
                            pRVar9 = local_c8;
                            uVar13 = local_c0;
                            pvVar8 = local_e0;
                          } while (iVar6 != -1);
                        }
                      }
                    }
                  }
                  uVar17 = uVar17 + 1;
                } while (uVar17 != uVar13);
              }
              free(pRVar9);
              free(__s);
              free(pvVar8);
              free(original);
              ref_edge_free(local_d0);
              return 0;
            }
            pcVar14 = "sort lengths";
            uVar12 = 0x83;
LAB_001b03c2:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,uVar12,"ref_collapse_pass",(ulong)uVar5,pcVar14);
            return uVar5;
          }
          pcVar14 = "malloc order of REF_INT NULL";
          uVar12 = 0x81;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
           uVar12,"ref_collapse_pass",pcVar14);
    RVar15 = 2;
  }
  return RVar15;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_DBL *ratio;
  REF_INT *order;
  REF_INT ntarget, *target, *node2target;
  REF_INT node, node0, node1;
  REF_INT i, edge;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL edge_ratio;

  if (ref_grid_surf(ref_grid)) {
    ref_cell = ref_grid_tri(ref_grid);
  } else {
    ref_cell = ref_grid_tet(ref_grid);
  }

  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");

  ref_malloc_init(ratio, ref_node_max(ref_node), REF_DBL,
                  2.0 * ref_grid_adapt(ref_grid, collapse_ratio));

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    ratio[node0] = MIN(ratio[node0], edge_ratio);
    ratio[node1] = MIN(ratio[node1], edge_ratio);
  }

  ref_malloc(target, ref_node_n(ref_node), REF_INT);
  ref_malloc_init(node2target, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  ntarget = 0;
  for (node = 0; node < ref_node_max(ref_node); node++)
    if (ratio[node] < ref_grid_adapt(ref_grid, collapse_ratio)) {
      node2target[node] = ntarget;
      target[ntarget] = node;
      ratio[ntarget] = ratio[node];
      ntarget++;
    }

  ref_malloc(order, ntarget, REF_INT);

  RSS(ref_sort_heap_dbl(ntarget, ratio, order), "sort lengths");

  for (i = 0; i < ntarget; i++) {
    if (ratio[order[i]] > ref_grid_adapt(ref_grid, collapse_ratio)) continue;
    node1 = target[order[i]];
    if (!ref_node_valid(ref_node, node1)) continue;
    RSS(ref_collapse_to_remove_node1(ref_grid, &node0, node1), "collapse rm");
    if (!ref_node_valid(ref_node, node1)) {
      ref_node_age(ref_node, node0) = 0;
      each_ref_cell_having_node(ref_cell, node0, item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
        for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
          if (REF_EMPTY != node2target[nodes[node]]) {
            ratio[node2target[nodes[node]]] =
                2.0 * ref_grid_adapt(ref_grid, collapse_ratio);
          }
        }
      }
    }
  }

  ref_free(order);
  ref_free(node2target);
  ref_free(target);
  ref_free(ratio);

  ref_edge_free(ref_edge);

  return REF_SUCCESS;
}